

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> *field)

{
  TagModuleField *pTVar1;
  long lVar2;
  ModuleFieldList *pMVar3;
  Tag *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pTVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>.
           _M_t.
           super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
           .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl;
  if (*(long *)(pTVar1 + 0x48) != 0) {
    local_48 = *(Tag **)(pTVar1 + 0x18);
    uStack_40 = *(undefined4 *)(pTVar1 + 0x20);
    uStack_3c = *(undefined4 *)(pTVar1 + 0x24);
    local_38 = *(undefined4 *)(pTVar1 + 0x28);
    uStack_34 = *(undefined4 *)(pTVar1 + 0x2c);
    uStack_30 = *(undefined4 *)(pTVar1 + 0x30);
    uStack_2c = *(undefined4 *)(pTVar1 + 0x34);
    local_28 = (undefined4)((ulong)(*(long *)&this->field_0x78 - *(long *)&this->tags) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->tag_bindings,0,pTVar1 + 0x40);
  }
  local_48 = (Tag *)(pTVar1 + 0x40);
  std::vector<wabt::Tag*,std::allocator<wabt::Tag*>>::emplace_back<wabt::Tag*>
            ((vector<wabt::Tag*,std::allocator<wabt::Tag*>> *)&this->tags,&local_48);
  pTVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>.
           _M_t.
           super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
           .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
  super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl = (TagModuleField *)0x0;
  if ((*(long *)(pTVar1 + 0x10) == 0) && (*(long *)(pTVar1 + 8) == 0)) {
    lVar2 = *(long *)&this->field_0x48;
    if (lVar2 == 0) {
      pMVar3 = &this->fields;
    }
    else {
      *(long *)(pTVar1 + 0x10) = lVar2;
      pMVar3 = (ModuleFieldList *)(lVar2 + 8);
    }
    *(TagModuleField **)pMVar3 = pTVar1;
    *(TagModuleField **)&this->field_0x48 = pTVar1;
    *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<TagModuleField> field) {
  Tag& tag = field->tag;
  if (!tag.name.empty()) {
    tag_bindings.emplace(tag.name, Binding(field->loc, tags.size()));
  }
  tags.push_back(&tag);
  fields.push_back(std::move(field));
}